

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemNSC::SetContactContainer
          (ChSystemNSC *this,shared_ptr<chrono::ChContactContainer> *container)

{
  __shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<chrono::ChContactContainer> local_28;
  
  std::dynamic_pointer_cast<chrono::ChContactContainerNSC,chrono::ChContactContainer>(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_28.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,
               &container->
                super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>);
    ChSystem::SetContactContainer
              (&this->super_ChSystem,(shared_ptr<chrono::ChContactContainer> *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void ChSystemNSC::SetContactContainer(std::shared_ptr<ChContactContainer> container) {
    if (std::dynamic_pointer_cast<ChContactContainerNSC>(container))
        ChSystem::SetContactContainer(container);
}